

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geofile_operations.cpp
# Opt level: O0

int __thiscall GEO::geofile::simplify_element(geofile *this,int *current_status)

{
  bool bVar1;
  ostream *this_00;
  int *current_status_local;
  geofile *this_local;
  
  switch(*current_status) {
  case 0:
    bVar1 = std::
            map<int,_GEO::point,_std::less<int>,_std::allocator<std::pair<const_int,_GEO::point>_>_>
            ::empty(&this->points_map);
    if (!bVar1) {
      simplify_points(this);
    }
    break;
  case 1:
    bVar1 = std::
            map<int,_GEO::line,_std::less<int>,_std::allocator<std::pair<const_int,_GEO::line>_>_>::
            empty(&this->lines_map);
    if (!bVar1) {
      simplify_lines(this);
    }
    break;
  case 2:
    bVar1 = std::
            map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
            ::empty(&this->curve_loops_map);
    if (!bVar1) {
      simplify_curve_loops(this);
    }
    break;
  case 3:
    bVar1 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::empty
                      (&this->plane_surfaces_map);
    if (!bVar1) {
      simplify_plane_surfaces(this);
    }
    break;
  case 4:
    bVar1 = std::
            map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
            ::empty(&this->surface_loops_map);
    if (!bVar1) {
      simplify_surface_loops(this);
    }
    break;
  case 5:
    bVar1 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::empty
                      (&this->volumes_map);
    if (!bVar1) {
      simplify_volumes(this);
    }
    break;
  default:
    this_00 = std::operator<<((ostream *)&std::cout,
                              "Error: Unknown state in GEO::geofile::simplify_element.");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    return 1;
  }
  return 0;
}

Assistant:

int GEO::geofile::simplify_element(int &current_status)
{
    switch (current_status)
    {
    case 0:
        if(!points_map.empty())
            simplify_points();
        break;
    case 1:
        if(!lines_map.empty())
            simplify_lines();
        break;
    case 2:
        if(!curve_loops_map.empty())
            simplify_curve_loops();
        break;
    case 3:
        if(!plane_surfaces_map.empty())
            simplify_plane_surfaces();
        break;
    case 4:
        if(!surface_loops_map.empty())
            simplify_surface_loops();
        break;
    case 5:
        if(!volumes_map.empty())
            simplify_volumes();
        break;
    default:
        std::cout   << "Error: Unknown state in GEO::geofile::simplify_element."
                    << std::endl;
        return EXIT_FAILURE;
        break;
    }
    return EXIT_SUCCESS;
}